

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

ArrayBuilder<kj::OwnFd> * __thiscall
kj::ArrayBuilder<kj::OwnFd>::operator=(ArrayBuilder<kj::OwnFd> *this,ArrayBuilder<kj::OwnFd> *other)

{
  OwnFd *pOVar1;
  RemoveConst<kj::OwnFd> *pRVar2;
  OwnFd *pOVar3;
  ArrayDisposer *pAVar4;
  
  pOVar1 = this->ptr;
  if (pOVar1 != (OwnFd *)0x0) {
    pRVar2 = this->pos;
    pOVar3 = this->endPtr;
    this->ptr = (OwnFd *)0x0;
    this->pos = (RemoveConst<kj::OwnFd> *)0x0;
    this->endPtr = (OwnFd *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pOVar1,4,(long)pRVar2 - (long)pOVar1 >> 2,
               (long)pOVar3 - (long)pOVar1 >> 2,ArrayDisposer::Dispose_<kj::OwnFd>::destruct);
  }
  pRVar2 = other->pos;
  this->ptr = other->ptr;
  this->pos = pRVar2;
  pAVar4 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar4;
  other->ptr = (OwnFd *)0x0;
  other->pos = (RemoveConst<kj::OwnFd> *)0x0;
  other->endPtr = (OwnFd *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }